

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMacroCommand.cxx
# Opt level: O3

cmCommand * __thiscall cmMacroHelperCommand::Clone(cmMacroHelperCommand *this)

{
  _func_int **pp_Var1;
  cmMakefile *pcVar2;
  size_type sVar3;
  cmCommand *pcVar4;
  
  pcVar4 = (cmCommand *)operator_new(0xa8);
  pcVar4->Makefile = (cmMakefile *)0x0;
  (pcVar4->Error)._M_dataplus._M_p = (pointer)&(pcVar4->Error).field_2;
  (pcVar4->Error)._M_string_length = 0;
  (pcVar4->Error).field_2._M_local_buf[0] = '\0';
  pcVar4->_vptr_cmCommand = (_func_int **)&PTR__cmMacroHelperCommand_00621720;
  pcVar4[1]._vptr_cmCommand = (_func_int **)0x0;
  pcVar4[1].Makefile = (cmMakefile *)0x0;
  pcVar4[1].Error._M_dataplus._M_p = (pointer)0x0;
  pcVar4[1].Error._M_string_length = 0;
  pcVar4[1].Error.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pcVar4[1].Error.field_2 + 8) = 0;
  pcVar4[2]._vptr_cmCommand = (_func_int **)0x0;
  pcVar4[2].Makefile = (cmMakefile *)0x0;
  pcVar4[2].Error._M_dataplus._M_p = (pointer)0x0;
  pcVar4[2].Error._M_string_length = 0;
  pcVar4[2].Error.field_2._M_allocated_capacity = 0;
  *(cmMakefile ***)((long)&pcVar4[2].Error.field_2 + 8) = &pcVar4[3].Makefile;
  pcVar4[3]._vptr_cmCommand = (_func_int **)0x0;
  *(undefined1 *)&pcVar4[3].Makefile = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(pcVar4 + 1),&this->Args);
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::operator=
            ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)
             &pcVar4[1].Error._M_string_length,&this->Functions);
  std::__cxx11::string::_M_assign((string *)(pcVar4[2].Error.field_2._M_local_buf + 8));
  pcVar4[2].Error.field_2._M_allocated_capacity =
       (this->Policies).Status.super__Base_bitset<5UL>._M_w[4];
  pp_Var1 = (_func_int **)(this->Policies).Status.super__Base_bitset<5UL>._M_w[0];
  pcVar2 = (cmMakefile *)(this->Policies).Status.super__Base_bitset<5UL>._M_w[1];
  sVar3 = (this->Policies).Status.super__Base_bitset<5UL>._M_w[3];
  pcVar4[2].Error._M_dataplus._M_p =
       (pointer)(this->Policies).Status.super__Base_bitset<5UL>._M_w[2];
  pcVar4[2].Error._M_string_length = sVar3;
  pcVar4[2]._vptr_cmCommand = pp_Var1;
  pcVar4[2].Makefile = pcVar2;
  return pcVar4;
}

Assistant:

cmCommand* Clone() override
  {
    cmMacroHelperCommand* newC = new cmMacroHelperCommand;
    // we must copy when we clone
    newC->Args = this->Args;
    newC->Functions = this->Functions;
    newC->FilePath = this->FilePath;
    newC->Policies = this->Policies;
    return newC;
  }